

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

double __thiscall smf::MidiFile::getFileDurationInSeconds(MidiFile *this)

{
  bool bVar1;
  int iVar2;
  MidiEventList *pMVar3;
  MidiEvent *pMVar4;
  int local_34;
  MidiFile *pMStack_30;
  int i;
  double output;
  MidiFile *mf;
  bool revertToDelta;
  MidiFile *this_local;
  
  if (((this->m_timemapvalid & 1U) == 0) && (buildTimeMap(this), (this->m_timemapvalid & 1U) == 0))
  {
    this_local = (MidiFile *)0xbff0000000000000;
  }
  else {
    bVar1 = isDeltaTicks(this);
    if (bVar1) {
      makeAbsoluteTicks(this);
    }
    pMStack_30 = (MidiFile *)0x0;
    for (local_34 = 0; iVar2 = getTrackCount(this), local_34 < iVar2; local_34 = local_34 + 1) {
      pMVar3 = operator[](this,local_34);
      pMVar4 = MidiEventList::back(pMVar3);
      if ((double)pMStack_30 < (double)pMVar4->tick) {
        pMVar3 = operator[](this,local_34);
        pMVar4 = MidiEventList::back(pMVar3);
        pMStack_30 = (MidiFile *)pMVar4->seconds;
      }
    }
    if (bVar1) {
      deltaTicks(this);
    }
    this_local = pMStack_30;
  }
  return (double)this_local;
}

Assistant:

double MidiFile::getFileDurationInSeconds(void) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}
	bool revertToDelta = false;
	if (isDeltaTicks()) {
		makeAbsoluteTicks();
		revertToDelta = true;
	}
	const MidiFile& mf = *this;
	double output = 0.0;
	for (int i=0; i<mf.getTrackCount(); i++) {
		if (mf[i].back().tick > output) {
			output = mf[i].back().seconds;
		}
	}
	if (revertToDelta) {
		deltaTicks();
	}
	return output;
}